

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-lib.cpp
# Opt level: O1

void __thiscall LibClass::LibClass(LibClass *this)

{
  double *pdVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  
  (this->m_Str)._M_dataplus._M_p = (pointer)&(this->m_Str).field_2;
  (this->m_Str)._M_string_length = 0;
  (this->m_Str).field_2._M_local_buf[0] = '\0';
  (this->m_Vec).super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_Vec).super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_Vec).super__Vector_base<unsigned_long_*,_std::allocator<unsigned_long_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_replace((ulong)this,0,(char *)0x0,0x1042d6);
  this->m_Num = 1000;
  pdVar1 = (double *)operator_new(8);
  *pdVar1 = 1.2345;
  this->m_DoublePtr = pdVar1;
  puVar2 = (undefined8 *)operator_new(8);
  puVar3 = (undefined8 *)operator_new(8);
  *puVar3 = 0x408f3f1a9fbe76c9;
  *puVar2 = puVar3;
  this->m_InnerMember = puVar2;
  return;
}

Assistant:

LibClass::LibClass() {
    m_Str = "TestClass2";
    m_Num = 1000;
    m_DoublePtr = new double(1.2345);
    m_InnerMember = new LibInternalClass();
}